

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_points.cpp
# Opt level: O2

void __thiscall
Am_Point_Array_Data::Am_Point_Array_Data(Am_Point_Array_Data *this,int *coords,int num_coords)

{
  undefined8 in_RAX;
  long lVar1;
  undefined1 auVar2 [16];
  undefined8 uStack_38;
  
  (this->super_Am_Wrapper).refs = 1;
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002eb5e0;
  (this->points).super__Vector_base<XPoint,_std::allocator<XPoint>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->points).super__Vector_base<XPoint,_std::allocator<XPoint>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->points).super__Vector_base<XPoint,_std::allocator<XPoint>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  uStack_38 = in_RAX;
  std::vector<XPoint,_std::allocator<XPoint>_>::reserve(&this->points,(long)(num_coords / 2));
  for (lVar1 = 0; lVar1 < (num_coords / 2) * 2; lVar1 = lVar1 + 2) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)(coords + lVar1);
    auVar2 = pshuflw(auVar2,auVar2,0xe8);
    uStack_38 = CONCAT44(auVar2._0_4_,(undefined4)uStack_38);
    std::vector<XPoint,_std::allocator<XPoint>_>::push_back
              (&this->points,(value_type *)((long)&uStack_38 + 4));
  }
  return;
}

Assistant:

Am_Point_Array_Data::Am_Point_Array_Data(int *coords, int num_coords)
{
  const int size = num_coords / 2;
  points.reserve(size);
  for (int i = 0; i < (2 * size); i += 2) {
    const XPoint xp = {static_cast<short>(coords[i]),
                       static_cast<short>(coords[i + 1])};
    points.push_back(xp);
  }
}